

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error cio_socket_set_keep_alive
                    (cio_socket *socket,_Bool on,uint keep_idle_s,uint keep_intvl_s,uint keep_cnt)

{
  int iVar1;
  int *piVar2;
  undefined4 local_2c;
  uint local_28;
  int keep_alive;
  uint keep_cnt_local;
  uint keep_intvl_s_local;
  uint keep_idle_s_local;
  _Bool on_local;
  cio_socket *socket_local;
  
  local_2c = 0;
  local_28 = keep_cnt;
  keep_alive = keep_intvl_s;
  keep_cnt_local = keep_idle_s;
  keep_intvl_s_local._3_1_ = on;
  _keep_idle_s_local = socket;
  if (on) {
    local_2c = 1;
    iVar1 = setsockopt((socket->impl).ev.fd,6,4,&keep_cnt_local,4);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    iVar1 = setsockopt((_keep_idle_s_local->impl).ev.fd,6,5,&keep_alive,4);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    iVar1 = setsockopt((_keep_idle_s_local->impl).ev.fd,6,6,&local_28,4);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
  }
  iVar1 = setsockopt((_keep_idle_s_local->impl).ev.fd,1,9,&local_2c,4);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    socket_local._4_4_ = -*piVar2;
  }
  else {
    socket_local._4_4_ = CIO_SUCCESS;
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_error cio_socket_set_keep_alive(const struct cio_socket *socket, bool on, unsigned int keep_idle_s,
                                         unsigned int keep_intvl_s, unsigned int keep_cnt)
{
	int keep_alive = 0;

	if (on) {
		keep_alive = 1;
		if (setsockopt(socket->impl.ev.fd, SOL_TCP, TCP_KEEPIDLE, &keep_idle_s, sizeof(keep_idle_s)) == -1) {
			return (enum cio_error)(-errno);
		}

		if (setsockopt(socket->impl.ev.fd, SOL_TCP, TCP_KEEPINTVL, &keep_intvl_s, sizeof(keep_intvl_s)) == -1) {
			return (enum cio_error)(-errno);
		}

		if (setsockopt(socket->impl.ev.fd, SOL_TCP, TCP_KEEPCNT, &keep_cnt, sizeof(keep_cnt)) == -1) {
			return (enum cio_error)(-errno);
		}
	}

	if (setsockopt(socket->impl.ev.fd, SOL_SOCKET, SO_KEEPALIVE, &keep_alive, sizeof(keep_alive)) == -1) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}